

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_257,_true,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  vint4 ai;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vint4 ai_3;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vint4 ai_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 bi_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 bi_3;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  vfloat4 a0;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar46;
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar49;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar55;
  float fVar56;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar27 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar28 = vrsqrtss_avx(auVar27,auVar27);
      fVar38 = auVar28._0_4_;
      local_818[0] = fVar38 * 1.5 - auVar27._0_4_ * 0.5 * fVar38 * fVar38 * fVar38;
      fVar38 = (ray->dir).field_0.m128[0];
      fVar2 = (ray->dir).field_0.m128[1];
      auVar32 = vshufps_avx(ZEXT416((uint)local_818[0]),ZEXT416((uint)local_818[0]),0);
      auVar39._0_4_ = aVar5.x * auVar32._0_4_;
      auVar39._4_4_ = aVar5.y * auVar32._4_4_;
      auVar39._8_4_ = aVar5.z * auVar32._8_4_;
      auVar39._12_4_ = aVar5.field_3.w * auVar32._12_4_;
      auVar28 = vshufpd_avx(auVar39,auVar39,1);
      auVar27 = vmovshdup_avx(auVar39);
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      auVar40._12_4_ = 0;
      auVar40._0_12_ = ZEXT812(0);
      auVar40 = auVar40 << 0x20;
      auVar43 = vunpckhps_avx(auVar39,auVar40);
      auVar35 = vshufps_avx(auVar43,ZEXT416(auVar27._0_4_ ^ 0x80000000),0x41);
      auVar43._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      auVar43._8_8_ = auVar28._8_8_ ^ auVar63._8_8_;
      auVar43 = vinsertps_avx(auVar43,auVar39,0x2a);
      auVar27 = vdpps_avx(auVar35,auVar35,0x7f);
      auVar28 = vdpps_avx(auVar43,auVar43,0x7f);
      auVar27 = vcmpps_avx(auVar28,auVar27,1);
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar27 = vblendvps_avx(auVar43,auVar35,auVar27);
      auVar28 = vdpps_avx(auVar27,auVar27,0x7f);
      auVar43 = vrsqrtss_avx(auVar28,auVar28);
      fVar41 = auVar43._0_4_;
      auVar28 = ZEXT416((uint)(fVar41 * 1.5 - auVar28._0_4_ * 0.5 * fVar41 * fVar41 * fVar41));
      auVar28 = vshufps_avx(auVar28,auVar28,0);
      auVar44._0_4_ = auVar27._0_4_ * auVar28._0_4_;
      auVar44._4_4_ = auVar27._4_4_ * auVar28._4_4_;
      auVar44._8_4_ = auVar27._8_4_ * auVar28._8_4_;
      auVar44._12_4_ = auVar27._12_4_ * auVar28._12_4_;
      auVar27 = vshufps_avx(auVar44,auVar44,0xc9);
      auVar28 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar57._0_4_ = auVar28._0_4_ * auVar44._0_4_;
      auVar57._4_4_ = auVar28._4_4_ * auVar44._4_4_;
      auVar57._8_4_ = auVar28._8_4_ * auVar44._8_4_;
      auVar57._12_4_ = auVar28._12_4_ * auVar44._12_4_;
      auVar50._0_4_ = auVar27._0_4_ * auVar39._0_4_;
      auVar50._4_4_ = auVar27._4_4_ * auVar39._4_4_;
      auVar50._8_4_ = auVar27._8_4_ * auVar39._8_4_;
      auVar50._12_4_ = auVar27._12_4_ * auVar39._12_4_;
      auVar27 = vsubps_avx(auVar50,auVar57);
      auVar43 = vshufps_avx(auVar27,auVar27,0xc9);
      auVar27 = vdpps_avx(auVar43,auVar43,0x7f);
      auVar28 = vrsqrtss_avx(auVar27,auVar27);
      fVar41 = auVar28._0_4_;
      auVar27 = ZEXT416((uint)(fVar41 * 1.5 - fVar41 * fVar41 * fVar41 * auVar27._0_4_ * 0.5));
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar28._0_4_ = auVar43._0_4_ * auVar27._0_4_;
      auVar28._4_4_ = auVar43._4_4_ * auVar27._4_4_;
      auVar28._8_4_ = auVar43._8_4_ * auVar27._8_4_;
      auVar28._12_4_ = auVar43._12_4_ * auVar27._12_4_;
      auVar27._0_4_ = auVar32._0_4_ * auVar39._0_4_;
      auVar27._4_4_ = auVar32._4_4_ * auVar39._4_4_;
      auVar27._8_4_ = auVar32._8_4_ * auVar39._8_4_;
      auVar27._12_4_ = auVar32._12_4_ * auVar39._12_4_;
      auVar43 = vunpcklps_avx(auVar44,auVar27);
      auVar27 = vunpckhps_avx(auVar44,auVar27);
      auVar32 = vunpcklps_avx(auVar28,auVar40);
      auVar28 = vunpckhps_avx(auVar28,auVar40);
      local_7e8 = vunpcklps_avx(auVar27,auVar28);
      local_808 = vunpcklps_avx(auVar43,auVar32);
      local_7f8 = vunpckhps_avx(auVar43,auVar32);
      puVar13 = local_7d0;
      auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar5,auVar32);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar35,1);
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      auVar28 = vdivps_avx(auVar17,(undefined1  [16])aVar5);
      auVar36._8_4_ = 0x5d5e0b6b;
      auVar36._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar36._12_4_ = 0x5d5e0b6b;
      auVar27 = vblendvps_avx(auVar28,auVar36,auVar27);
      auVar24._0_4_ = auVar27._0_4_ * 0.99999964;
      auVar24._4_4_ = auVar27._4_4_ * 0.99999964;
      auVar24._8_4_ = auVar27._8_4_ * 0.99999964;
      auVar24._12_4_ = auVar27._12_4_ * 0.99999964;
      auVar33._0_4_ = auVar27._0_4_ * 1.0000004;
      auVar33._4_4_ = auVar27._4_4_ * 1.0000004;
      auVar33._8_4_ = auVar27._8_4_ * 1.0000004;
      auVar33._12_4_ = auVar27._12_4_ * 1.0000004;
      auVar32 = vshufps_avx(auVar24,auVar24,0);
      auVar27 = vmovshdup_avx(auVar24);
      uVar15 = (ulong)(auVar24._0_4_ < 0.0) * 0x10;
      auVar35 = vshufps_avx(auVar24,auVar24,0x55);
      auVar28 = vshufpd_avx(auVar24,auVar24,1);
      uVar12 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
      auVar27 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar40 = vshufps_avx(auVar33,auVar33,0);
      auVar24 = vshufps_avx(auVar33,auVar33,0x55);
      auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
      uVar14 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x40;
      auVar28 = vshufps_avx(auVar43,auVar43,0);
      auVar43 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      fVar1 = (ray->dir).field_0.m128[2];
      fVar41 = (ray->org).field_0.m128[0];
      auVar64._4_4_ = fVar41;
      auVar64._0_4_ = fVar41;
      auVar64._8_4_ = fVar41;
      auVar64._12_4_ = fVar41;
      fVar3 = (ray->org).field_0.m128[1];
      auVar66._4_4_ = fVar3;
      auVar66._0_4_ = fVar3;
      auVar66._8_4_ = fVar3;
      auVar66._12_4_ = fVar3;
      fVar4 = (ray->org).field_0.m128[2];
      auVar68._4_4_ = fVar4;
      auVar68._0_4_ = fVar4;
      auVar68._8_4_ = fVar4;
      auVar68._12_4_ = fVar4;
LAB_002bcf26:
      if (puVar13 != &local_7d8) {
        uVar10 = puVar13[-1];
        puVar13 = puVar13 + -1;
LAB_002bcf37:
        if ((uVar10 & 0xf) == 0) {
          auVar17 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar15),auVar64);
          auVar16._0_4_ = auVar32._0_4_ * auVar17._0_4_;
          auVar16._4_4_ = auVar32._4_4_ * auVar17._4_4_;
          auVar16._8_4_ = auVar32._8_4_ * auVar17._8_4_;
          auVar16._12_4_ = auVar32._12_4_ * auVar17._12_4_;
          auVar17 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar12),auVar66);
          auVar20._0_4_ = auVar35._0_4_ * auVar17._0_4_;
          auVar20._4_4_ = auVar35._4_4_ * auVar17._4_4_;
          auVar20._8_4_ = auVar35._8_4_ * auVar17._8_4_;
          auVar20._12_4_ = auVar35._12_4_ * auVar17._12_4_;
          auVar17 = vmaxps_avx(auVar16,auVar20);
          auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar14),auVar68);
          auVar21._0_4_ = auVar27._0_4_ * auVar36._0_4_;
          auVar21._4_4_ = auVar27._4_4_ * auVar36._4_4_;
          auVar21._8_4_ = auVar27._8_4_ * auVar36._8_4_;
          auVar21._12_4_ = auVar27._12_4_ * auVar36._12_4_;
          auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar15 ^ 0x10)),auVar64);
          auVar25._0_4_ = auVar40._0_4_ * auVar36._0_4_;
          auVar25._4_4_ = auVar40._4_4_ * auVar36._4_4_;
          auVar25._8_4_ = auVar40._8_4_ * auVar36._8_4_;
          auVar25._12_4_ = auVar40._12_4_ * auVar36._12_4_;
          auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar12 ^ 0x10)),auVar66);
          auVar29._0_4_ = auVar24._0_4_ * auVar36._0_4_;
          auVar29._4_4_ = auVar24._4_4_ * auVar36._4_4_;
          auVar29._8_4_ = auVar24._8_4_ * auVar36._8_4_;
          auVar29._12_4_ = auVar24._12_4_ * auVar36._12_4_;
          auVar39 = vminps_avx(auVar25,auVar29);
          auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar14 ^ 0x10)),auVar68);
          auVar30._0_4_ = auVar33._0_4_ * auVar36._0_4_;
          auVar30._4_4_ = auVar33._4_4_ * auVar36._4_4_;
          auVar30._8_4_ = auVar33._8_4_ * auVar36._8_4_;
          auVar30._12_4_ = auVar33._12_4_ * auVar36._12_4_;
          auVar36 = vmaxps_avx(auVar21,auVar28);
          auVar17 = vmaxps_avx(auVar17,auVar36);
          auVar36 = vminps_avx(auVar30,auVar43);
          auVar36 = vminps_avx(auVar39,auVar36);
          auVar17 = vcmpps_avx(auVar17,auVar36,2);
        }
        else {
          if ((int)(uVar10 & 0xf) != 2) {
            cVar7 = (**(code **)((long)This->leafIntersector +
                                (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40 + 8))
                              (local_818,ray,context);
            if (cVar7 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_002bcf26;
          }
          uVar9 = uVar10 & 0xfffffffffffffff0;
          auVar58._0_4_ =
               fVar1 * *(float *)(uVar9 + 0x80) + fVar2 * *(float *)(uVar9 + 0x50) +
               fVar38 * *(float *)(uVar9 + 0x20);
          auVar58._4_4_ =
               fVar1 * *(float *)(uVar9 + 0x84) + fVar2 * *(float *)(uVar9 + 0x54) +
               fVar38 * *(float *)(uVar9 + 0x24);
          auVar58._8_4_ =
               fVar1 * *(float *)(uVar9 + 0x88) + fVar2 * *(float *)(uVar9 + 0x58) +
               fVar38 * *(float *)(uVar9 + 0x28);
          auVar58._12_4_ =
               fVar1 * *(float *)(uVar9 + 0x8c) + fVar2 * *(float *)(uVar9 + 0x5c) +
               fVar38 * *(float *)(uVar9 + 0x2c);
          auVar45._0_4_ =
               fVar1 * *(float *)(uVar9 + 0x90) + fVar2 * *(float *)(uVar9 + 0x60) +
               fVar38 * *(float *)(uVar9 + 0x30);
          auVar45._4_4_ =
               fVar1 * *(float *)(uVar9 + 0x94) + fVar2 * *(float *)(uVar9 + 100) +
               fVar38 * *(float *)(uVar9 + 0x34);
          auVar45._8_4_ =
               fVar1 * *(float *)(uVar9 + 0x98) + fVar2 * *(float *)(uVar9 + 0x68) +
               fVar38 * *(float *)(uVar9 + 0x38);
          auVar45._12_4_ =
               fVar1 * *(float *)(uVar9 + 0x9c) + fVar2 * *(float *)(uVar9 + 0x6c) +
               fVar38 * *(float *)(uVar9 + 0x3c);
          auVar51._0_4_ =
               fVar1 * *(float *)(uVar9 + 0xa0) + fVar2 * *(float *)(uVar9 + 0x70) +
               fVar38 * *(float *)(uVar9 + 0x40);
          auVar51._4_4_ =
               fVar1 * *(float *)(uVar9 + 0xa4) + fVar2 * *(float *)(uVar9 + 0x74) +
               fVar38 * *(float *)(uVar9 + 0x44);
          auVar51._8_4_ =
               fVar1 * *(float *)(uVar9 + 0xa8) + fVar2 * *(float *)(uVar9 + 0x78) +
               fVar38 * *(float *)(uVar9 + 0x48);
          auVar51._12_4_ =
               fVar1 * *(float *)(uVar9 + 0xac) + fVar2 * *(float *)(uVar9 + 0x7c) +
               fVar38 * *(float *)(uVar9 + 0x4c);
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar17 = vandps_avx(auVar58,auVar67);
          auVar69._8_4_ = 0x219392ef;
          auVar69._0_8_ = 0x219392ef219392ef;
          auVar69._12_4_ = 0x219392ef;
          auVar17 = vcmpps_avx(auVar17,auVar69,1);
          auVar36 = vblendvps_avx(auVar58,auVar69,auVar17);
          auVar17 = vandps_avx(auVar45,auVar67);
          auVar17 = vcmpps_avx(auVar17,auVar69,1);
          auVar39 = vblendvps_avx(auVar45,auVar69,auVar17);
          auVar17 = vandps_avx(auVar51,auVar67);
          auVar17 = vcmpps_avx(auVar17,auVar69,1);
          auVar17 = vblendvps_avx(auVar51,auVar69,auVar17);
          auVar44 = vrcpps_avx(auVar36);
          fVar42 = auVar44._0_4_;
          auVar52._0_4_ = fVar42 * auVar36._0_4_;
          fVar46 = auVar44._4_4_;
          auVar52._4_4_ = fVar46 * auVar36._4_4_;
          fVar47 = auVar44._8_4_;
          auVar52._8_4_ = fVar47 * auVar36._8_4_;
          fVar48 = auVar44._12_4_;
          auVar52._12_4_ = fVar48 * auVar36._12_4_;
          auVar70._8_4_ = 0x3f800000;
          auVar70._0_8_ = 0x3f8000003f800000;
          auVar70._12_4_ = 0x3f800000;
          auVar36 = vsubps_avx(auVar70,auVar52);
          fVar42 = fVar42 + fVar42 * auVar36._0_4_;
          fVar46 = fVar46 + fVar46 * auVar36._4_4_;
          fVar47 = fVar47 + fVar47 * auVar36._8_4_;
          fVar48 = fVar48 + fVar48 * auVar36._12_4_;
          auVar36 = vrcpps_avx(auVar39);
          fVar49 = auVar36._0_4_;
          auVar59._0_4_ = fVar49 * auVar39._0_4_;
          fVar53 = auVar36._4_4_;
          auVar59._4_4_ = fVar53 * auVar39._4_4_;
          fVar54 = auVar36._8_4_;
          auVar59._8_4_ = fVar54 * auVar39._8_4_;
          fVar55 = auVar36._12_4_;
          auVar59._12_4_ = fVar55 * auVar39._12_4_;
          auVar36 = vsubps_avx(auVar70,auVar59);
          fVar49 = fVar49 + fVar49 * auVar36._0_4_;
          fVar53 = fVar53 + fVar53 * auVar36._4_4_;
          fVar54 = fVar54 + fVar54 * auVar36._8_4_;
          fVar55 = fVar55 + fVar55 * auVar36._12_4_;
          auVar36 = vrcpps_avx(auVar17);
          fVar56 = auVar36._0_4_;
          auVar65._0_4_ = fVar56 * auVar17._0_4_;
          fVar60 = auVar36._4_4_;
          auVar65._4_4_ = fVar60 * auVar17._4_4_;
          fVar61 = auVar36._8_4_;
          auVar65._8_4_ = fVar61 * auVar17._8_4_;
          fVar62 = auVar36._12_4_;
          auVar65._12_4_ = fVar62 * auVar17._12_4_;
          auVar17 = vsubps_avx(auVar70,auVar65);
          fVar56 = fVar56 + fVar56 * auVar17._0_4_;
          fVar60 = fVar60 + fVar60 * auVar17._4_4_;
          fVar61 = fVar61 + fVar61 * auVar17._8_4_;
          fVar62 = fVar62 + fVar62 * auVar17._12_4_;
          auVar26._0_4_ =
               (fVar41 * *(float *)(uVar9 + 0x20) +
               fVar3 * *(float *)(uVar9 + 0x50) +
               fVar4 * *(float *)(uVar9 + 0x80) + *(float *)(uVar9 + 0xb0)) * -fVar42;
          auVar26._4_4_ =
               (fVar41 * *(float *)(uVar9 + 0x24) +
               fVar3 * *(float *)(uVar9 + 0x54) +
               fVar4 * *(float *)(uVar9 + 0x84) + *(float *)(uVar9 + 0xb4)) * -fVar46;
          auVar26._8_4_ =
               (fVar41 * *(float *)(uVar9 + 0x28) +
               fVar3 * *(float *)(uVar9 + 0x58) +
               fVar4 * *(float *)(uVar9 + 0x88) + *(float *)(uVar9 + 0xb8)) * -fVar47;
          auVar26._12_4_ =
               (fVar41 * *(float *)(uVar9 + 0x2c) +
               fVar3 * *(float *)(uVar9 + 0x5c) +
               fVar4 * *(float *)(uVar9 + 0x8c) + *(float *)(uVar9 + 0xbc)) * -fVar48;
          auVar22._0_4_ =
               (fVar41 * *(float *)(uVar9 + 0x30) +
               fVar3 * *(float *)(uVar9 + 0x60) +
               fVar4 * *(float *)(uVar9 + 0x90) + *(float *)(uVar9 + 0xc0)) * -fVar49;
          auVar22._4_4_ =
               (fVar41 * *(float *)(uVar9 + 0x34) +
               fVar3 * *(float *)(uVar9 + 100) +
               fVar4 * *(float *)(uVar9 + 0x94) + *(float *)(uVar9 + 0xc4)) * -fVar53;
          auVar22._8_4_ =
               (fVar41 * *(float *)(uVar9 + 0x38) +
               fVar3 * *(float *)(uVar9 + 0x68) +
               fVar4 * *(float *)(uVar9 + 0x98) + *(float *)(uVar9 + 200)) * -fVar54;
          auVar22._12_4_ =
               (fVar41 * *(float *)(uVar9 + 0x3c) +
               fVar3 * *(float *)(uVar9 + 0x6c) +
               fVar4 * *(float *)(uVar9 + 0x9c) + *(float *)(uVar9 + 0xcc)) * -fVar55;
          auVar18._0_4_ =
               (fVar41 * *(float *)(uVar9 + 0x40) +
               fVar3 * *(float *)(uVar9 + 0x70) +
               fVar4 * *(float *)(uVar9 + 0xa0) + *(float *)(uVar9 + 0xd0)) * -fVar56;
          auVar18._4_4_ =
               (fVar41 * *(float *)(uVar9 + 0x44) +
               fVar3 * *(float *)(uVar9 + 0x74) +
               fVar4 * *(float *)(uVar9 + 0xa4) + *(float *)(uVar9 + 0xd4)) * -fVar60;
          auVar18._8_4_ =
               (fVar41 * *(float *)(uVar9 + 0x48) +
               fVar3 * *(float *)(uVar9 + 0x78) +
               fVar4 * *(float *)(uVar9 + 0xa8) + *(float *)(uVar9 + 0xd8)) * -fVar61;
          auVar18._12_4_ =
               (fVar41 * *(float *)(uVar9 + 0x4c) +
               fVar3 * *(float *)(uVar9 + 0x7c) +
               fVar4 * *(float *)(uVar9 + 0xac) + *(float *)(uVar9 + 0xdc)) * -fVar62;
          auVar31._0_4_ = fVar42 + auVar26._0_4_;
          auVar31._4_4_ = fVar46 + auVar26._4_4_;
          auVar31._8_4_ = fVar47 + auVar26._8_4_;
          auVar31._12_4_ = fVar48 + auVar26._12_4_;
          auVar34._0_4_ = fVar49 + auVar22._0_4_;
          auVar34._4_4_ = fVar53 + auVar22._4_4_;
          auVar34._8_4_ = fVar54 + auVar22._8_4_;
          auVar34._12_4_ = fVar55 + auVar22._12_4_;
          auVar37._0_4_ = fVar56 + auVar18._0_4_;
          auVar37._4_4_ = fVar60 + auVar18._4_4_;
          auVar37._8_4_ = fVar61 + auVar18._8_4_;
          auVar37._12_4_ = fVar62 + auVar18._12_4_;
          auVar17 = vpminsd_avx(auVar22,auVar34);
          auVar36 = vpminsd_avx(auVar18,auVar37);
          auVar17 = vmaxps_avx(auVar17,auVar36);
          auVar50 = vpminsd_avx(auVar26,auVar31);
          auVar44 = vpmaxsd_avx(auVar26,auVar31);
          auVar36 = vpmaxsd_avx(auVar22,auVar34);
          auVar39 = vpmaxsd_avx(auVar18,auVar37);
          auVar39 = vminps_avx(auVar36,auVar39);
          auVar36 = vmaxps_avx(auVar28,auVar50);
          auVar17 = vmaxps_avx(auVar36,auVar17);
          auVar36 = vminps_avx(auVar43,auVar44);
          auVar36 = vminps_avx(auVar36,auVar39);
          auVar23._0_4_ = auVar17._0_4_ * 0.99999964;
          auVar23._4_4_ = auVar17._4_4_ * 0.99999964;
          auVar23._8_4_ = auVar17._8_4_ * 0.99999964;
          auVar23._12_4_ = auVar17._12_4_ * 0.99999964;
          auVar19._0_4_ = auVar36._0_4_ * 1.0000004;
          auVar19._4_4_ = auVar36._4_4_ * 1.0000004;
          auVar19._8_4_ = auVar36._8_4_ * 1.0000004;
          auVar19._12_4_ = auVar36._12_4_ * 1.0000004;
          auVar17 = vcmpps_avx(auVar23,auVar19,2);
        }
        auVar17 = vpslld_avx(auVar17,0x1f);
        uVar8 = vmovmskps_avx(auVar17);
        if (uVar8 == 0) goto LAB_002bcf26;
        uVar8 = uVar8 & 0xff;
        uVar9 = uVar10 & 0xfffffffffffffff0;
        lVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
        uVar8 = uVar8 - 1 & uVar8;
        if (uVar8 != 0) {
          *puVar13 = uVar10;
          puVar13 = puVar13 + 1;
          lVar6 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
          uVar8 = uVar8 - 1 & uVar8;
          uVar11 = (ulong)uVar8;
          if (uVar8 != 0) {
            do {
              *puVar13 = uVar10;
              puVar13 = puVar13 + 1;
              lVar6 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
              uVar11 = uVar11 & uVar11 - 1;
            } while (uVar11 != 0);
          }
        }
        goto LAB_002bcf37;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }